

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wildmidi_lib.cpp
# Opt level: O3

void do_sysex_gm_reset(_mdi *mdi,_event_data *data)

{
  _patch *p_Var1;
  long lVar2;
  
  lVar2 = 0x73;
  do {
    *(undefined1 *)((long)mdi->channel + lVar2 + -0x73) = 0;
    if (lVar2 == 0x223) {
      p_Var1 = (_patch *)0x0;
    }
    else {
      p_Var1 = get_patch_data(0);
    }
    *(_patch **)((long)mdi->channel + lVar2 + -0x6b) = p_Var1;
    *(undefined4 *)((long)mdi->channel + lVar2 + -99) = 0x7f7f6400;
    *(undefined2 *)((long)mdi->channel + lVar2 + -0x5f) = 0x4040;
    *(undefined4 *)((long)mdi->channel + lVar2 + -0x59) = 0xc80000;
    *(undefined2 *)((long)mdi->channel + lVar2 + -0x4b) = 0xffff;
    *(undefined1 *)((long)mdi->channel + lVar2 + -0x48) = 0;
    lVar2 = lVar2 + 0x30;
  } while (lVar2 != 0x373);
  _WM_AdjustChannelVolumes(mdi,'\x10');
  mdi->channel[9].isdrum = '\x01';
  return;
}

Assistant:

static void do_sysex_gm_reset(struct _mdi *mdi, struct _event_data *data) {
	int i;
	for (i = 0; i < 16; i++) {
		mdi->channel[i].bank = 0;
		if (i != 9) {
			mdi->channel[i].patch = get_patch_data(0);
		} else {
			mdi->channel[i].patch = NULL;
		}
		mdi->channel[i].hold = 0;
		mdi->channel[i].volume = 100;
		mdi->channel[i].pressure = 127;
		mdi->channel[i].expression = 127;
		mdi->channel[i].balance = 64;
		mdi->channel[i].pan = 64;
		mdi->channel[i].pitch = 0;
		mdi->channel[i].pitch_range = 200;
		mdi->channel[i].reg_data = 0xFFFF;
		mdi->channel[i].isdrum = 0;
	}
	/* I would not expect notes to be active when this event
	 triggers but we'll adjust active notes as well just in case */
	_WM_AdjustChannelVolumes(mdi,16); // A setting > 15 adjusts all channels

	mdi->channel[9].isdrum = 1;
	UNUSED(data); /* NOOP, to please the compiler gods */
}